

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O2

void __thiscall
SolverTest_PrintSolution_Test::~SolverTest_PrintSolution_Test(SolverTest_PrintSolution_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SolverTest, PrintSolution) {
  int num_values = 3;
  const double values[] = {1.0, 2.5, 3.0};
  mp::NameProvider np("", "foo", num_values);
  EXPECT_WRITE(
    stdout, mp::internal::PrintSolution(values, num_values, "bar", "baz", np),
    "\n"
    "bar     baz\n"
    "foo[1]  1\n"
    "foo[2]  2.5\n"
    "foo[3]  3\n");
}